

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O0

int sc_core::sc_report_handler::stop_after(char *msg_type_,int limit)

{
  sc_msg_def *psVar1;
  uint in_ESI;
  char *in_stack_00000008;
  int old;
  sc_msg_def *md;
  uint local_20;
  char *in_stack_ffffffffffffffe8;
  
  psVar1 = mdlookup(in_stack_ffffffffffffffe8);
  if (psVar1 == (sc_msg_def *)0x0) {
    psVar1 = add_msg_type(in_stack_00000008);
  }
  if ((psVar1->limit_mask & 1) == 0) {
    local_20 = 0xffffffff;
  }
  else {
    local_20 = psVar1->limit;
  }
  if ((int)in_ESI < 0) {
    psVar1->limit_mask = psVar1->limit_mask & 0xfffffffe;
  }
  else {
    psVar1->limit_mask = psVar1->limit_mask | 1;
    psVar1->limit = in_ESI;
  }
  return local_20;
}

Assistant:

int sc_report_handler::stop_after(const char * msg_type_, int limit)
{
    sc_msg_def * md = mdlookup(msg_type_);

    if ( !md )
	md = add_msg_type(msg_type_);

    int old = md->limit_mask & 1 ? md->limit: UINT_MAX;

    if ( limit < 0 )
	md->limit_mask &= ~1;
    else
    {
	md->limit_mask |= 1;
	md->limit = limit;
    }
    return old;
}